

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestForeign(void)

{
  _Alloc_hider data;
  size_type size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  function_buffer *this;
  OutputBuffer buf;
  free_func local_140;
  string world;
  OutputBuffer copy;
  undefined4 local_ec;
  string there;
  string hello;
  size_type local_a8;
  string local_a0 [32];
  undefined1 local_80 [40];
  char *local_58;
  char *local_50;
  const_string local_48;
  const_string local_38;
  
  there._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  there._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  there.field_2._M_allocated_capacity = 0x411;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&there);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  world._M_dataplus._M_p._0_1_ = 1;
  hello._M_string_length._0_1_ = 0;
  hello._M_dataplus._M_p = "lp\x1b";
  hello.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  hello.field_2._8_8_ = anon_var_dwarf_9116b;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&world,(lazy_ostream *)&hello);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&world);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hello,"hello ",(allocator<char> *)&there);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&there,"there ",(allocator<char> *)&world);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&world,"world ",(allocator<char> *)&local_140);
  avro::OutputBuffer::OutputBuffer(&copy,0);
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo
            (buf.pimpl_.px,hello._M_dataplus._M_p,
             CONCAT71(hello._M_string_length._1_7_,(undefined1)hello._M_string_length));
  size = there._M_string_length;
  data = there._M_dataplus;
  std::__cxx11::string::string(local_a0,(string *)&there);
  boost::bind<void,std::__cxx11::string_const&,std::__cxx11::string>
            ((bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80,(boost *)deleteForeign,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             local_a0,in_RCX);
  boost::function<void()>::
  function<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<std::__cxx11::string>>>>
            ((function<void()> *)&local_140,
             (bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80,0);
  avro::detail::BufferImpl::appendForeignData(buf.pimpl_.px,data._M_p,size,&local_140);
  boost::function0<void>::~function0(&local_140.super_function0<void>);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string(local_a0);
  avro::detail::BufferImpl::writeTo
            (buf.pimpl_.px,
             (data_type *)CONCAT71(world._M_dataplus._M_p._1_7_,world._M_dataplus._M_p._0_1_),
             world._M_string_length);
  avro::InputBuffer::InputBuffer((InputBuffer *)&local_140,&buf);
  printBuffer((InputBuffer *)&local_140);
  this = &local_140.super_function0<void>.super_function_base.functor;
  boost::detail::shared_count::~shared_count((shared_count *)this);
  local_38.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_38.m_end = "";
  local_48.m_begin = "";
  local_48.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_38,0x420,&local_48);
  local_140.super_function0<void>.super_function_base.functor.data[0] = '\0';
  local_140.super_function0<void>.super_function_base.vtable =
       (vtable_base *)&PTR__lazy_ostream_001ea848;
  local_140.super_function0<void>.super_function_base.functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  local_140.super_function0<void>.super_function_base.functor._16_8_ = (long)"\t" + 1;
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_50 = "";
  local_a8 = (buf.pimpl_.px)->size_;
  local_ec = 0x12;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_140,&local_58,0x420,1,2,&local_a8,"buf.size()",&local_ec,"18U");
  boost::shared_ptr<avro::detail::BufferImpl>::operator=(&copy.pimpl_,&buf.pimpl_);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  std::operator<<((ostream *)&std::cout,"Leaving inner scope\n");
  safeToDelete = true;
  boost::detail::shared_count::~shared_count(&copy.pimpl_.pn);
  std::__cxx11::string::~string((string *)&world);
  std::__cxx11::string::~string((string *)&there);
  std::__cxx11::string::~string((string *)&hello);
  std::operator<<((ostream *)&std::cout,"Leaving outer scope\n");
  safeToDelete = false;
  return;
}

Assistant:

void TestForeign ()  
{
    BOOST_TEST_MESSAGE( "TestForeign");
    {
        std::string hello = "hello ";
        std::string there = "there ";
        std::string world = "world ";

        OutputBuffer copy;

        {
            OutputBuffer buf;
            buf.writeTo(hello.c_str(), hello.size());
            buf.appendForeignData(there.c_str(), there.size(), boost::bind(&deleteForeign, there));
            buf.writeTo(world.c_str(), world.size());
        
            printBuffer(buf);
            BOOST_CHECK_EQUAL(buf.size(), 18U);
            copy = buf;
        }
        std::cout << "Leaving inner scope\n";
        safeToDelete = true;
    }
    std::cout << "Leaving outer scope\n";
    safeToDelete = false;
}